

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_rowcol
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  ulong uVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong size;
  int iVar18;
  int iVar19;
  char *__format;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint local_110;
  int local_10c;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_94;
  ulong local_88;
  long local_80;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "_s2";
LAB_004fe6ff:
    fprintf(_stderr,__format,"parasail_sw_stats_rowcol",pcVar14);
    return (parasail_result_t *)0x0;
  }
  local_88 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar14 = "s2Len";
    goto LAB_004fe6ff;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar14 = "open";
    goto LAB_004fe6ff;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar14 = "gap";
    goto LAB_004fe6ff;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "matrix";
    goto LAB_004fe6ff;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_sw_stats_rowcol");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar14 = "_s1";
      goto LAB_004fe6ff;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar14 = "_s1Len";
      goto LAB_004fe6ff;
    }
    if (matrix->type == 0) goto LAB_004fde85;
  }
  _s1Len = matrix->length;
LAB_004fde85:
  ppVar10 = parasail_result_new_rowcol3(_s1Len,s2Len);
  if (ppVar10 != (parasail_result_t *)0x0) {
    ppVar10->flag = ppVar10->flag | 0x1450104;
    ptr = parasail_memalign_int(0x10,(long)_s1Len);
    ptr_00 = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
    size = (ulong)(s2Len + 1);
    ptr_01 = parasail_memalign_int(0x10,size);
    ptr_02 = parasail_memalign_int(0x10,size);
    ptr_03 = parasail_memalign_int(0x10,size);
    ptr_04 = parasail_memalign_int(0x10,size);
    ptr_05 = parasail_memalign_int(0x10,size);
    ptr_06 = parasail_memalign_int(0x10,size);
    ptr_07 = parasail_memalign_int(0x10,size);
    ptr_08 = parasail_memalign_int(0x10,size);
    auVar28._0_4_ = -(uint)((int)ptr == 0);
    auVar28._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
    auVar28._8_4_ = -(uint)((int)ptr_00 == 0);
    auVar28._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
    auVar33._4_4_ = auVar28._0_4_;
    auVar33._0_4_ = auVar28._4_4_;
    auVar33._8_4_ = auVar28._12_4_;
    auVar33._12_4_ = auVar28._8_4_;
    auVar29._0_4_ = -(uint)((int)ptr_01 == 0);
    auVar29._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
    auVar29._8_4_ = -(uint)((int)ptr_02 == 0);
    auVar29._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
    auVar34._4_4_ = auVar29._0_4_;
    auVar34._0_4_ = auVar29._4_4_;
    auVar34._8_4_ = auVar29._12_4_;
    auVar34._12_4_ = auVar29._8_4_;
    auVar34 = packssdw(auVar33 & auVar28,auVar34 & auVar29);
    auVar31._0_4_ = -(uint)((int)ptr_03 == 0);
    auVar31._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
    auVar31._8_4_ = -(uint)((int)ptr_04 == 0);
    auVar31._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
    auVar27._4_4_ = auVar31._0_4_;
    auVar27._0_4_ = auVar31._4_4_;
    auVar27._8_4_ = auVar31._12_4_;
    auVar27._12_4_ = auVar31._8_4_;
    auVar32._0_4_ = -(uint)((int)ptr_05 == 0);
    auVar32._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
    auVar32._8_4_ = -(uint)((int)ptr_06 == 0);
    auVar32._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
    auVar30._4_4_ = auVar32._0_4_;
    auVar30._0_4_ = auVar32._4_4_;
    auVar30._8_4_ = auVar32._12_4_;
    auVar30._12_4_ = auVar32._8_4_;
    auVar28 = packssdw(auVar27 & auVar31,auVar30 & auVar32);
    auVar28 = packssdw(auVar34,auVar28);
    uVar11 = 0;
    if ((ptr_08 != (int *)0x0 && ptr_07 != (int *)0x0) &&
        ((((((((auVar28 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar28 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar28 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar28 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar28[0xf]))
    {
      uVar21 = 0;
      if (0 < _s1Len) {
        uVar21 = (ulong)(uint)_s1Len;
      }
      for (; uVar21 != uVar11; uVar11 = uVar11 + 1) {
        ptr[uVar11] = matrix->mapper[(byte)_s1[uVar11]];
      }
      piVar6 = matrix->mapper;
      for (uVar11 = 0; (uint)s2Len != uVar11; uVar11 = uVar11 + 1) {
        ptr_00[uVar11] = piVar6[(byte)_s2[uVar11]];
      }
      *ptr_01 = 0;
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = -0x40000000;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      for (uVar11 = 1; size != uVar11; uVar11 = uVar11 + 1) {
        ptr_01[uVar11] = 0;
        ptr_02[uVar11] = 0;
        ptr_03[uVar11] = 0;
        ptr_04[uVar11] = 0;
        ptr_05[uVar11] = -0x40000000;
        ptr_06[uVar11] = 0;
        ptr_07[uVar11] = 0;
        ptr_08[uVar11] = 0;
      }
      local_ec = -0x40000000;
      local_f0 = -0x40000000;
      local_f4 = -0x40000000;
      local_f8 = -0x40000000;
      local_110 = _s1Len;
      for (uVar11 = 1; uVar11 != (int)uVar21 + 1; uVar11 = uVar11 + 1) {
        if (matrix->type == 0) {
          lVar12 = (long)ptr[uVar11 - 1];
        }
        else {
          lVar12 = uVar11 - 1;
        }
        local_80 = uVar11 - 1;
        lVar12 = matrix->size * lVar12;
        piVar6 = matrix->matrix;
        iVar24 = *ptr_01;
        iVar25 = *ptr_02;
        iVar18 = *ptr_03;
        iVar1 = *ptr_04;
        *ptr_01 = 0;
        *ptr_02 = 0;
        *ptr_03 = 0;
        *ptr_04 = 0;
        local_94 = -0x40000000;
        iVar26 = 0;
        iVar13 = 0;
        iVar20 = 0;
        local_10c = 0;
        local_a0 = 0;
        local_9c = 0;
        local_a4 = 0;
        for (uVar23 = 1; size != uVar23; uVar23 = uVar23 + 1) {
          iVar2 = ptr_01[uVar23];
          iVar3 = ptr_02[uVar23];
          iVar4 = ptr_03[uVar23];
          iVar16 = iVar2 - open;
          iVar9 = ptr_05[uVar23] - gap;
          iVar17 = iVar9;
          if (iVar9 < iVar16) {
            iVar17 = iVar16;
          }
          iVar5 = ptr_04[uVar23];
          ptr_05[uVar23] = iVar17;
          iVar19 = iVar26 - open;
          iVar22 = local_94 - gap;
          local_94 = iVar19;
          if (iVar19 <= iVar22) {
            local_94 = iVar22;
          }
          iVar24 = iVar24 + piVar6[lVar12 + ptr_00[uVar23 - 1]];
          iVar15 = iVar24;
          if (iVar24 <= local_94) {
            iVar15 = local_94;
          }
          if (iVar15 <= iVar17) {
            iVar15 = iVar17;
          }
          iVar26 = iVar15;
          if (iVar15 < 1) {
            iVar26 = 0;
          }
          if (iVar9 < iVar16) {
            ptr_06[uVar23] = iVar3;
            ptr_07[uVar23] = iVar4;
            iVar17 = iVar5;
          }
          else {
            iVar17 = ptr_08[uVar23];
          }
          ptr_08[uVar23] = iVar17 + 1;
          if (iVar19 <= iVar22) {
            local_10c = local_a4;
            iVar13 = local_a0;
            iVar20 = local_9c;
          }
          local_9c = iVar20;
          local_a0 = iVar13;
          local_a4 = local_10c + 1;
          if (iVar26 == iVar24) {
            iVar13 = iVar25 + (uint)(ptr[uVar11 - 1] == ptr_00[uVar23 - 1]);
            iVar20 = iVar18 + (uint)(0 < piVar6[lVar12 + ptr_00[uVar23 - 1]]);
            local_10c = iVar1 + 1;
          }
          else {
            iVar13 = local_a0;
            iVar20 = local_9c;
            local_10c = local_a4;
            if (iVar26 == ptr_05[uVar23]) {
              iVar13 = ptr_06[uVar23];
              iVar20 = ptr_07[uVar23];
              local_10c = iVar17 + 1;
            }
          }
          if (iVar15 < 1) {
            iVar26 = 0;
            iVar13 = 0;
            iVar20 = 0;
            local_10c = 0;
          }
          ptr_01[uVar23] = iVar26;
          ptr_02[uVar23] = iVar13;
          ptr_03[uVar23] = iVar20;
          ptr_04[uVar23] = local_10c;
          uVar7 = (int)uVar11 - 1;
          iVar24 = local_10c;
          iVar25 = iVar20;
          iVar18 = iVar13;
          iVar1 = iVar26;
          uVar8 = uVar23 - 1;
          if (((iVar26 <= local_ec) &&
              (uVar7 = local_110, iVar24 = local_f8, iVar25 = local_f4, iVar18 = local_f0,
              iVar1 = local_ec, uVar8 = local_88, iVar26 == local_ec)) &&
             ((long)uVar23 <= (long)(int)local_88)) {
            uVar7 = (uint)local_80;
            iVar24 = local_10c;
            iVar25 = iVar20;
            iVar18 = iVar13;
            uVar8 = uVar23 - 1;
          }
          local_88 = uVar8;
          local_ec = iVar1;
          local_f0 = iVar18;
          local_f4 = iVar25;
          local_f8 = iVar24;
          local_110 = uVar7;
          iVar24 = iVar2;
          iVar25 = iVar3;
          iVar18 = iVar4;
          iVar1 = iVar5;
        }
        *(int *)(*(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x20) + local_80 * 4)
             = iVar26;
        *(int *)(*(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x28) + local_80 * 4)
             = iVar13;
        *(int *)(*(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x30) + local_80 * 4)
             = iVar20;
        *(int *)(*(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x38) + local_80 * 4)
             = local_10c;
      }
      for (uVar11 = 1; size != uVar11; uVar11 = uVar11 + 1) {
        *(int *)(*((ppVar10->field_4).trace)->trace_del_table + -4 + uVar11 * 4) = ptr_01[uVar11];
        *(int *)(*(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 8) + -4 + uVar11 * 4)
             = ptr_02[uVar11];
        *(int *)(*(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x10) + -4 +
                uVar11 * 4) = ptr_03[uVar11];
        *(int *)(*(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x18) + -4 +
                uVar11 * 4) = ptr_04[uVar11];
      }
      ppVar10->score = local_ec;
      ppVar10->end_query = local_110;
      ppVar10->end_ref = (int)local_88;
      ((ppVar10->field_4).stats)->matches = local_f0;
      ((ppVar10->field_4).stats)->similar = local_f4;
      ((ppVar10->field_4).stats)->length = local_f8;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar10;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = NEG_INF_32;
    similar = NEG_INF_32;
    length = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H  = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F  = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        HM[j] = 0;
        HS[j] = 0;
        HL[j] = 0;
        F[j] = NEG_INF_32;
        FM[j] = 0;
        FS[j] = 0;
        FL[j] = 0;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = 0;
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext  = F[j] - gap;
            F[j]  = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            if (WH == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (WH == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            if (WH <= 0) {
                WH = 0;
                WHM = 0;
                WHS = 0;
                WHL = 0;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
            if (WH > score) {
                score = WH;
                matches = WHM;
                similar = WHS;
                length = WHL;
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                matches = WHM;
                similar = WHS;
                length = WHL;
                end_query = i-1;
                end_ref = j-1;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}